

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsMetaDataSetIntegers
              (FmsMetaData mdata,char *mdata_name,FmsIntType int_type,FmsInt size,void **data)

{
  int iVar1;
  char *str_copy_p;
  long in_RCX;
  uint in_EDX;
  undefined4 *in_RDI;
  undefined8 *in_R8;
  void *md_data;
  size_t sizeof_int_type;
  int err;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_4;
  
  if (in_RDI == (undefined4 *)0x0) {
    local_4 = 1;
  }
  else if (in_EDX < 8) {
    if ((in_RCX == 0) || (in_R8 != (undefined8 *)0x0)) {
      local_4 = FmsMetaDataClear((FmsMetaData)
                                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (local_4 == 0) {
        if (in_RCX == 0) {
          str_copy_p = (char *)0x0;
        }
        else {
          str_copy_p = (char *)malloc(in_RCX * FmsIntTypeSize[in_EDX]);
          if (str_copy_p == (char *)0x0) {
            return 4;
          }
        }
        iVar1 = FmsCopyString(str_copy_p,(char **)str_copy_p);
        if (iVar1 == 0) {
          *in_RDI = 0;
          in_RDI[1] = in_EDX;
          *(long *)(in_RDI + 4) = in_RCX;
          *(char **)(in_RDI + 6) = str_copy_p;
          *in_R8 = str_copy_p;
          local_4 = 0;
        }
        else {
          free(str_copy_p);
          local_4 = 4;
        }
      }
    }
    else {
      local_4 = 3;
    }
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

int FmsMetaDataSetIntegers(FmsMetaData mdata, const char *mdata_name,
                           FmsIntType int_type, FmsInt size, void **data) {
  if (!mdata) { E_RETURN(1); }
  if (int_type >= FMS_NUM_INT_TYPES) { E_RETURN(2); }
  if (size && !data) { E_RETURN(3); }
  int err = FmsMetaDataClear(mdata);
  if (err) { E_RETURN(err); }
  const size_t sizeof_int_type = FmsIntTypeSize[int_type];
  void *md_data = size ? malloc(size*sizeof_int_type) : NULL;
  if (size && md_data == NULL) { E_RETURN(4); }
  // On error, call free(md_data)
  // Update mdata
  if (FmsCopyString(mdata_name, &mdata->name)) { free(md_data); E_RETURN(4); }
  mdata->md_type = FMS_INTEGER;
  mdata->sub_type.int_type = int_type;
  mdata->num_entries = size;
  mdata->data = md_data;
  *data = md_data;
  return 0;
}